

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_rh_no.c
# Opt level: O3

void glmc_look_anyup_rh_no(float *eye,float *dir,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float ignore;
  float local_2c;
  undefined1 local_28 [16];
  
  local_28 = ZEXT416((uint)*dir);
  fVar1 = modff(ABS(*dir) + 0.5,&local_2c);
  fVar5 = dir[1];
  fVar8 = (float)local_28._0_4_ - fVar1 * dir[2];
  fVar11 = ((float)local_28._0_4_ + *eye) - *eye;
  fVar9 = (fVar5 + eye[1]) - eye[1];
  fVar7 = (dir[2] + eye[2]) - eye[2];
  fVar2 = SQRT(fVar7 * fVar7 + fVar11 * fVar11 + fVar9 * fVar9);
  fVar10 = 1.0 / fVar2;
  fVar6 = 0.0;
  fVar3 = 0.0;
  fVar4 = 0.0;
  if (1.1920929e-07 <= fVar2) {
    fVar3 = fVar11 * fVar10;
    fVar4 = fVar9 * fVar10;
  }
  fVar2 = (float)(~-(uint)(fVar2 < 1.1920929e-07) & (uint)(fVar7 * fVar10));
  fVar10 = fVar4 * fVar1 * fVar5 - fVar8 * fVar2;
  fVar1 = -fVar5 * fVar2 - fVar1 * fVar5 * fVar3;
  fVar5 = fVar5 * fVar4 + fVar3 * fVar8;
  fVar9 = SQRT(fVar5 * fVar5 + fVar10 * fVar10 + fVar1 * fVar1);
  fVar8 = 1.0 / fVar9;
  fVar7 = 0.0;
  if (1.1920929e-07 <= fVar9) {
    fVar6 = fVar10 * fVar8;
    fVar7 = fVar1 * fVar8;
  }
  fVar9 = (float)(~-(uint)(fVar9 < 1.1920929e-07) & (uint)(fVar5 * fVar8));
  fVar5 = fVar7 * fVar2 - fVar4 * fVar9;
  fVar8 = fVar9 * fVar3 - fVar2 * fVar6;
  fVar1 = fVar6 * fVar4 - fVar3 * fVar7;
  (*dest)[0] = fVar6;
  (*dest)[1] = fVar5;
  (*dest)[2] = -fVar3;
  dest[1][0] = fVar7;
  dest[1][1] = fVar8;
  dest[1][2] = -fVar4;
  dest[2][0] = fVar9;
  dest[2][1] = fVar1;
  dest[2][2] = -fVar2;
  dest[3][0] = -(eye[2] * fVar9 + fVar6 * *eye + fVar7 * eye[1]);
  dest[3][1] = -(fVar1 * eye[2] + fVar5 * *eye + fVar8 * eye[1]);
  dest[3][2] = eye[2] * fVar2 + fVar3 * *eye + fVar4 * eye[1];
  dest[2][3] = 0.0;
  dest[1][3] = 0.0;
  (*dest)[3] = 0.0;
  dest[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_look_anyup_rh_no(vec3 eye, vec3 dir, mat4 dest) {
  glm_look_anyup_rh_no(eye, dir, dest);
}